

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_lost_clipboard_ownership(Terminal *term,wchar_t clipboard)

{
  wchar_t clipboard_local;
  Terminal *term_local;
  
  if ((L'\x01' < term->n_mouse_select_clipboards) && (clipboard == term->mouse_select_clipboards[1])
     ) {
    deselect(term);
    term_update(term);
    term_out(term,false);
  }
  return;
}

Assistant:

void term_lost_clipboard_ownership(Terminal *term, int clipboard)
{
    if (!(term->n_mouse_select_clipboards > 1 &&
          clipboard == term->mouse_select_clipboards[1]))
        return;

    deselect(term);
    term_update(term);

    /*
     * Since terminal output is suppressed during drag-selects, we
     * should make sure to write any pending output if one has just
     * finished.
     */
    term_out(term, false);
}